

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::InnerProduct_x86_avx::forward_fp16s
          (InnerProduct_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint _elempack;
  Mat local_c8;
  Option opt_flatten;
  
  local_c8.dims = bottom_blob->dims;
  if (local_c8.dims == 2) {
    iVar5 = (this->super_InnerProduct).num_output;
    local_c8.w = bottom_blob->w;
    if (local_c8.w == (this->super_InnerProduct).weight_data_size / iVar5) {
      Mat::create(top_blob,iVar5,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar5 = (this->super_InnerProduct).activation_type;
      iVar3 = cpu_support_x86_f16c();
      if (iVar3 == 0) {
        return 0;
      }
      innerproduct_gemm_fp16s_sse_f16c
                (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 iVar5,&(this->super_InnerProduct).activation_params,opt);
      return 0;
    }
  }
  else {
    local_c8.w = bottom_blob->w;
  }
  piVar2 = bottom_blob->refcount;
  local_c8.data = bottom_blob->data;
  local_c8.refcount = bottom_blob->refcount;
  local_c8.elemsize = bottom_blob->elemsize;
  local_c8.elempack = bottom_blob->elempack;
  local_c8.allocator = bottom_blob->allocator;
  local_c8.h = bottom_blob->h;
  local_c8.d = bottom_blob->d;
  local_c8.c = bottom_blob->c;
  local_c8.cstep = bottom_blob->cstep;
  iVar5 = local_c8.dims;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    iVar5 = bottom_blob->dims;
  }
  iVar3 = -100;
  if (iVar5 != 1) {
    opt_flatten.lightmode = opt->lightmode;
    opt_flatten.use_shader_pack8 = opt->use_shader_pack8;
    opt_flatten.use_subgroup_ops = opt->use_subgroup_ops;
    opt_flatten.use_reserved_0 = opt->use_reserved_0;
    opt_flatten.num_threads = opt->num_threads;
    opt_flatten.workspace_allocator = opt->workspace_allocator;
    opt_flatten.openmp_blocktime = opt->openmp_blocktime;
    opt_flatten.use_winograd_convolution = opt->use_winograd_convolution;
    opt_flatten.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_flatten.use_int8_inference = opt->use_int8_inference;
    opt_flatten.use_vulkan_compute = opt->use_vulkan_compute;
    opt_flatten.use_bf16_storage = opt->use_bf16_storage;
    opt_flatten.use_fp16_packed = opt->use_fp16_packed;
    opt_flatten.use_fp16_storage = opt->use_fp16_storage;
    opt_flatten.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_flatten.use_int8_packed = opt->use_int8_packed;
    opt_flatten.use_int8_storage = opt->use_int8_storage;
    opt_flatten.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_flatten.use_packing_layout = opt->use_packing_layout;
    opt_flatten.vulkan_device_index = opt->vulkan_device_index;
    opt_flatten.use_reserved_1 = opt->use_reserved_1;
    opt_flatten.use_image_storage = opt->use_image_storage;
    opt_flatten.use_tensor_storage = opt->use_tensor_storage;
    opt_flatten.use_reserved_2 = opt->use_reserved_2;
    opt_flatten.flush_denormals = opt->flush_denormals;
    opt_flatten.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_flatten.use_shader_local_memory = opt->use_shader_local_memory;
    opt_flatten.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_flatten.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_flatten.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_flatten.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_flatten.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_flatten.use_fp16_uniform = opt->use_fp16_uniform;
    opt_flatten.use_int8_uniform = opt->use_int8_uniform;
    opt_flatten.use_reserved_9 = opt->use_reserved_9;
    opt_flatten.use_reserved_10 = opt->use_reserved_10;
    opt_flatten.use_reserved_11 = opt->use_reserved_11;
    opt_flatten.blob_allocator = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_c8);
    if ((local_c8.data == (void *)0x0) || ((long)local_c8.c * local_c8.cstep == 0))
    goto LAB_002d955d;
  }
  uVar1 = (this->super_InnerProduct).num_output;
  if (opt->use_packing_layout == true) {
    _elempack = 8;
    if ((uVar1 & 7) != 0) {
      _elempack = (uint)((uVar1 & 3) == 0) * 3 + 1;
    }
  }
  else {
    _elempack = 1;
  }
  Mat::create(top_blob,(int)uVar1 / (int)_elempack,
              (ulong)_elempack * (local_c8.elemsize / (ulong)(long)local_c8.elempack),_elempack,
              opt->blob_allocator);
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar5 = (this->super_InnerProduct).activation_type;
    iVar4 = cpu_support_x86_f16c();
    iVar3 = 0;
    if (iVar4 != 0) {
      innerproduct_fp16s_sse_f16c
                (&local_c8,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
                 iVar5,&(this->super_InnerProduct).activation_params,opt);
    }
  }
LAB_002d955d:
  if (local_c8.refcount != (int *)0x0) {
    LOCK();
    *local_c8.refcount = *local_c8.refcount + -1;
    UNLOCK();
    if (*local_c8.refcount == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar3;
}

Assistant:

int InnerProduct_x86_avx::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}